

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall Catch::FatalConditionHandler::engage_platform(FatalConditionHandler *this)

{
  ulong local_c8;
  size_t i;
  sigaction sa;
  stack_t sigStack;
  FatalConditionHandler *this_local;
  
  sa.sa_restorer = altStackMem;
  sigaltstack((sigaltstack *)&sa.sa_restorer,(sigaltstack *)oldSigStack);
  memset(&i,0,0x98);
  i = (size_t)handleSignal;
  sa.sa_mask.__val[0xf]._0_4_ = 0x8000000;
  for (local_c8 = 0; local_c8 < 6; local_c8 = local_c8 + 1) {
    sigaction((&signalDefs)[local_c8 * 4],(sigaction *)&i,
              (sigaction *)(oldSigActions + local_c8 * 0x98));
  }
  return;
}

Assistant:

void FatalConditionHandler::engage_platform() {
        stack_t sigStack;
        sigStack.ss_sp = altStackMem;
        sigStack.ss_size = altStackSize;
        sigStack.ss_flags = 0;
        sigaltstack(&sigStack, &oldSigStack);
        struct sigaction sa = { };

        sa.sa_handler = handleSignal;
        sa.sa_flags = SA_ONSTACK;
        for (std::size_t i = 0; i < sizeof(signalDefs)/sizeof(SignalDefs); ++i) {
            sigaction(signalDefs[i].id, &sa, &oldSigActions[i]);
        }
    }